

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void print_states(Grammar *g)

{
  State *pSVar1;
  Elem *pEVar2;
  Elem *ee;
  Action *pAVar3;
  bool bVar4;
  uint uVar5;
  Rule *pRVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint local_44;
  Grammar *local_40;
  ulong local_38;
  
  if ((g->states).n != 0) {
    local_38 = 0;
    local_40 = g;
    do {
      pSVar1 = (local_40->states).v[local_38];
      local_44 = 0;
      pcVar7 = " ACCEPT";
      if ((pSVar1->field_0x178 & 1) == 0) {
        pcVar7 = "";
      }
      printf("STATE %d (%d ITEMS)%s\n",(ulong)pSVar1->index,(ulong)(pSVar1->items).n,pcVar7);
      if ((pSVar1->items).n != 0) {
        uVar8 = 0;
        do {
          pEVar2 = (pSVar1->items).v[uVar8];
          printf("\t%s: ",pEVar2->rule->prod->name);
          pRVar6 = pEVar2->rule;
          if ((pRVar6->elems).n == 0) {
LAB_0013c89d:
            printf(". ");
          }
          else {
            bVar4 = true;
            uVar9 = 0;
            do {
              ee = (pRVar6->elems).v[uVar9];
              if (ee == pEVar2) {
                bVar4 = false;
                printf(". ");
              }
              print_elem(ee);
              uVar9 = uVar9 + 1;
              pRVar6 = pEVar2->rule;
            } while (uVar9 < (pRVar6->elems).n);
            if (bVar4) goto LAB_0013c89d;
          }
          putchar(10);
          uVar8 = uVar8 + 1;
        } while (uVar8 < (pSVar1->items).n);
      }
      if (((pSVar1->gotos).n != 0) && (puts("  GOTO"), (pSVar1->gotos).n != 0)) {
        uVar8 = 0;
        do {
          putchar(9);
          print_elem((pSVar1->gotos).v[uVar8]->elem);
          printf(" : %d\n",(ulong)(pSVar1->gotos).v[uVar8]->state->index);
          uVar8 = uVar8 + 1;
        } while (uVar8 < (pSVar1->gotos).n);
      }
      puts("  ACTION");
      if ((pSVar1->reduce_actions).n == 0) {
        uVar5 = 0;
      }
      else {
        uVar8 = 0;
        do {
          pAVar3 = (pSVar1->reduce_actions).v[uVar8];
          printf("\t%s\t",action_types[pAVar3->kind]);
          print_rule(pAVar3->rule);
          putchar(10);
          uVar8 = uVar8 + 1;
          uVar5 = (pSVar1->reduce_actions).n;
        } while (uVar8 < uVar5);
      }
      if ((pSVar1->shift_actions).n != 0) {
        uVar8 = 0;
        do {
          pAVar3 = (pSVar1->shift_actions).v[uVar8];
          printf("\t%s\t",action_types[pAVar3->kind]);
          if (pAVar3->kind == ACTION_SHIFT) {
            print_term(pAVar3->term);
            printf("%d",(ulong)pAVar3->state->index);
          }
          putchar(10);
          uVar8 = uVar8 + 1;
        } while (uVar8 < (pSVar1->shift_actions).n);
        uVar5 = (pSVar1->reduce_actions).n;
      }
      if (1 < uVar5) {
        print_conflict("reduce/reduce",&local_44);
        uVar5 = (pSVar1->reduce_actions).n;
      }
      if ((uVar5 != 0) && ((pSVar1->shift_actions).n != 0)) {
        print_conflict("shift/reduce",&local_44);
      }
      putchar(10);
      local_38 = local_38 + 1;
    } while (local_38 < (local_40->states).n);
  }
  return;
}

Assistant:

void print_states(Grammar *g) {
  uint i;

  for (i = 0; i < g->states.n; i++) print_state(g->states.v[i]);
}